

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwtDec.c
# Opt level: O1

void Rwt_ManPreprocess(Rwt_Man_t *p)

{
  byte bVar1;
  short sVar2;
  Rwt_Node_t *pRVar3;
  uint *puVar4;
  Dec_Edge_t DVar5;
  unsigned_short *__s;
  Vec_Vec_t *pVVar6;
  void **ppvVar7;
  undefined8 *puVar8;
  void *pvVar9;
  Rwt_Node_t *pGraph_00;
  Rwt_Node_t *pRVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint uVar15;
  long lVar16;
  Dec_Graph_t *pGraph;
  
  __s = (unsigned_short *)malloc(0x1bc);
  p->pMapInv = __s;
  lVar14 = 0;
  memset(__s,0,0x1bc);
  pVVar6 = (Vec_Vec_t *)malloc(0x10);
  pVVar6->nCap = 0xde;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(0x6f0);
  pVVar6->pArray = ppvVar7;
  do {
    puVar8 = (undefined8 *)malloc(0x10);
    *puVar8 = 0;
    puVar8[1] = 0;
    ppvVar7[lVar14] = puVar8;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 0xde);
  pVVar6->nSize = 0xde;
  p->vClasses = pVVar6;
  if (0 < p->nFuncs) {
    lVar14 = 0;
    do {
      for (pRVar3 = p->pTable[lVar14]; pRVar3 != (Rwt_Node_t *)0x0; pRVar3 = pRVar3->pNext) {
        if (*(ushort *)&pRVar3->field_0x8 != *(ushort *)&p->pTable[lVar14]->field_0x8) {
          __assert_fail("pNode->uTruth == p->pTable[i]->uTruth",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,0x41,"void Rwt_ManPreprocess(Rwt_Man_t *)");
        }
        bVar1 = p->pMap[*(ushort *)&pRVar3->field_0x8];
        if (0xdd < bVar1) {
          __assert_fail("p->pMap[pNode->uTruth] < 222",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,0x42,"void Rwt_ManPreprocess(Rwt_Man_t *)");
        }
        pVVar6 = p->vClasses;
        uVar13 = (uint)bVar1;
        if (pVVar6->nSize <= (int)(uint)bVar1) {
          iVar11 = bVar1 + 1;
          if (pVVar6->nCap <= (int)(uint)bVar1) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)(uint)(iVar11 * 8));
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)(uint)(iVar11 * 8));
            }
            pVVar6->pArray = ppvVar7;
            pVVar6->nCap = iVar11;
          }
          iVar12 = pVVar6->nSize;
          lVar16 = (long)iVar12;
          if (iVar12 <= (int)uVar13) {
            iVar12 = (uVar13 - iVar12) + 1;
            do {
              puVar8 = (undefined8 *)malloc(0x10);
              *puVar8 = 0;
              puVar8[1] = 0;
              pVVar6->pArray[lVar16] = puVar8;
              lVar16 = lVar16 + 1;
              iVar12 = iVar12 + -1;
            } while (iVar12 != 0);
          }
          pVVar6->nSize = iVar11;
        }
        if (pVVar6->nSize <= (int)uVar13) goto LAB_008d022f;
        puVar4 = (uint *)pVVar6->pArray[uVar13];
        uVar13 = *puVar4;
        if (puVar4[1] == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (*(void **)(puVar4 + 2) == (void *)0x0) {
              pvVar9 = malloc(0x80);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar4 + 2),0x80);
            }
            *(void **)(puVar4 + 2) = pvVar9;
            uVar15 = 0x10;
          }
          else {
            uVar15 = uVar13 * 2;
            if ((int)uVar15 <= (int)uVar13) goto LAB_008d0077;
            if (*(void **)(puVar4 + 2) == (void *)0x0) {
              pvVar9 = malloc((ulong)uVar13 << 4);
            }
            else {
              pvVar9 = realloc(*(void **)(puVar4 + 2),(ulong)uVar13 << 4);
            }
            *(void **)(puVar4 + 2) = pvVar9;
          }
          *puVar4 = uVar15;
        }
LAB_008d0077:
        uVar13 = puVar4[1];
        puVar4[1] = uVar13 + 1;
        *(Rwt_Node_t **)(*(long *)(puVar4 + 2) + (long)(int)uVar13 * 8) = pRVar3;
        p->pMapInv[p->pMap[*(ushort *)&pRVar3->field_0x8]] =
             p->puCanons[*(ushort *)&pRVar3->field_0x8];
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->nFuncs);
  }
  if (0 < p->vClasses->nSize) {
    lVar14 = 0;
    do {
      pVVar6 = p->vClasses;
      if (pVVar6->nSize <= lVar14) {
LAB_008d022f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecVec.h"
                      ,0x111,"Vec_Ptr_t *Vec_VecEntry(Vec_Vec_t *, int)");
      }
      lVar16 = 0;
      while (lVar16 < *(int *)((long)pVVar6->pArray[lVar14] + 4)) {
        pRVar3 = *(Rwt_Node_t **)(*(long *)((long)pVVar6->pArray[lVar14] + 8) + lVar16 * 8);
        if (((ulong)pRVar3 & 1) != 0) {
          __assert_fail("!Rwt_IsComplement(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/rwt/rwtDec.c"
                        ,0x5f,"Dec_Graph_t *Rwt_NodePreprocess(Rwt_Man_t *, Rwt_Node_t *)");
        }
        sVar2 = *(short *)&pRVar3->field_0x8;
        pGraph_00 = (Rwt_Node_t *)malloc(0x20);
        pGraph_00->Id = 0;
        pGraph_00->TravId = 0;
        *(undefined8 *)&pGraph_00->field_0x8 = 0;
        pGraph_00->p0 = (Rwt_Node_t *)0x0;
        pGraph_00->p1 = (Rwt_Node_t *)0x0;
        if (sVar2 == 0xff) {
          *(undefined8 *)&pGraph_00->TravId = 0x400000004;
          *(undefined4 *)&pGraph_00->field_0xc = 0x3a;
          pRVar10 = (Rwt_Node_t *)malloc(0x570);
          pGraph_00->p0 = pRVar10;
          pRVar10->Id = 0;
          pRVar10->TravId = 0;
          *(undefined8 *)&pRVar10->field_0x8 = 0;
          pRVar10->p0 = (Rwt_Node_t *)0x0;
          pRVar10->p1 = (Rwt_Node_t *)0x0;
          pRVar10->pNext = (Rwt_Node_t *)0x0;
          pRVar10[1].Id = 0;
          pRVar10[1].TravId = 0;
          *(undefined8 *)&pRVar10[1].field_0x8 = 0;
          pRVar10[1].p0 = (Rwt_Node_t *)0x0;
          pRVar10[1].p1 = (Rwt_Node_t *)0x0;
          pRVar10[1].pNext = (Rwt_Node_t *)0x0;
          pRVar10[2].Id = 0;
          pRVar10[2].TravId = 0;
          *(undefined8 *)&pRVar10[2].field_0x8 = 0;
          DVar5 = (Dec_Edge_t)(*(uint *)&pGraph_00->p1 & 0x80000000 | 7);
LAB_008d01ee:
          *(Dec_Edge_t *)&pGraph_00->p1 = DVar5;
        }
        else {
          if (sVar2 != 0) {
            *(undefined8 *)&pGraph_00->TravId = 0x400000004;
            *(undefined4 *)&pGraph_00->field_0xc = 0x3a;
            pRVar10 = (Rwt_Node_t *)malloc(0x570);
            pGraph_00->p0 = pRVar10;
            pRVar10->Id = 0;
            pRVar10->TravId = 0;
            *(undefined8 *)&pRVar10->field_0x8 = 0;
            pRVar10->p0 = (Rwt_Node_t *)0x0;
            pRVar10->p1 = (Rwt_Node_t *)0x0;
            pRVar10->pNext = (Rwt_Node_t *)0x0;
            pRVar10[1].Id = 0;
            pRVar10[1].TravId = 0;
            *(undefined8 *)&pRVar10[1].field_0x8 = 0;
            pRVar10[1].p0 = (Rwt_Node_t *)0x0;
            pRVar10[1].p1 = (Rwt_Node_t *)0x0;
            pRVar10[1].pNext = (Rwt_Node_t *)0x0;
            pRVar10[2].Id = 0;
            pRVar10[2].TravId = 0;
            *(undefined8 *)&pRVar10[2].field_0x8 = 0;
            Rwt_ManIncTravId(p);
            DVar5 = Rwt_TravCollect_rec(p,pRVar3,(Dec_Graph_t *)pGraph_00);
            goto LAB_008d01ee;
          }
          pGraph_00->Id = 1;
          *(byte *)&pGraph_00->p1 = *(byte *)&pGraph_00->p1 | 1;
        }
        pRVar3->pNext = pGraph_00;
        lVar16 = lVar16 + 1;
        pVVar6 = p->vClasses;
        if (pVVar6->nSize <= lVar14) goto LAB_008d022f;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < p->vClasses->nSize);
  }
  return;
}

Assistant:

void Rwt_ManPreprocess( Rwt_Man_t * p )
{
    Dec_Graph_t * pGraph;
    Rwt_Node_t * pNode;
    int i, k;
    // put the nodes into the structure
    p->pMapInv  = ABC_ALLOC( unsigned short, 222 );
    memset( p->pMapInv, 0, sizeof(unsigned short) * 222 );
    p->vClasses = Vec_VecStart( 222 );
    for ( i = 0; i < p->nFuncs; i++ )
    {
        if ( p->pTable[i] == NULL )
            continue;
        // consider all implementations of this function
        for ( pNode = p->pTable[i]; pNode; pNode = pNode->pNext )
        {
            assert( pNode->uTruth == p->pTable[i]->uTruth );
            assert( p->pMap[pNode->uTruth] < 222 ); // Always >= 0 b/c unsigned.
            Vec_VecPush( p->vClasses, p->pMap[pNode->uTruth], pNode );
            p->pMapInv[ p->pMap[pNode->uTruth] ] = p->puCanons[pNode->uTruth];
        }
    }
    // compute decomposition forms for each node and verify them
    Vec_VecForEachEntry( Rwt_Node_t *, p->vClasses, pNode, i, k )
    {
        pGraph = Rwt_NodePreprocess( p, pNode );
        pNode->pNext = (Rwt_Node_t *)pGraph;
//        assert( pNode->uTruth == (Dec_GraphDeriveTruth(pGraph) & 0xFFFF) );
    }
}